

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_tga.cxx
# Opt level: O2

bool __thiscall xray_re::xr_image::save_tga(xr_image *this,string *path)

{
  bool bVar1;
  xr_memory_writer *this_00;
  
  this_00 = (xr_memory_writer *)operator_new(0x2078);
  xr_memory_writer::xr_memory_writer(this_00);
  save_tga(this,(xr_writer *)this_00);
  bVar1 = xr_memory_writer::save_to(this_00,path);
  (*(this_00->super_xr_writer)._vptr_xr_writer[1])(this_00);
  return bVar1;
}

Assistant:

bool xr_image::save_tga(const std::string& path) const
{
	xr_memory_writer* w = new xr_memory_writer();
	save_tga(*w);
	bool status = w->save_to(path);
	delete w;
	return status;
}